

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::PipelineStateVkImpl::~PipelineStateVkImpl(PipelineStateVkImpl *this)

{
  PipelineStateBase<Diligent::EngineVkImplTraits>::GetStatus
            (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>,true);
  Destruct(this);
  std::
  _Vector_base<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>_>
  ::~_Vector_base(&(this->m_ResourceAttibutions).
                   super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>_>
                 );
  std::
  vector<std::shared_ptr<const_Diligent::SPIRVShaderResources>,_std::allocator<std::shared_ptr<const_Diligent::SPIRVShaderResources>_>_>
  ::~vector(&this->m_ShaderResources);
  PipelineLayoutVk::~PipelineLayoutVk(&this->m_PipelineLayout);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  ~VulkanObjectWrapper(&this->m_Pipeline);
  PipelineStateBase<Diligent::EngineVkImplTraits>::~PipelineStateBase
            (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  return;
}

Assistant:

PipelineStateVkImpl::~PipelineStateVkImpl()
{
    // Make sure that asynchrous task is complete as it references the pipeline object.
    // This needs to be done in the final class before the destruction begins.
    GetStatus(/*WaitForCompletion =*/true);

    Destruct();
}